

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall
spv::Builder::makeMatrixDebugType(Builder *this,Id vectorType,int vectorCount,bool columnMajor)

{
  unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
  *this_00;
  ulong uVar1;
  pointer puVar2;
  iterator __position;
  Builder *pBVar3;
  Id IVar4;
  mapped_type *pmVar5;
  Instruction *pIVar6;
  mapped_type_conflict *pmVar7;
  vector<spv::Instruction*,std::allocator<spv::Instruction*>> *this_01;
  undefined7 in_register_00000009;
  Id IVar8;
  long lVar9;
  Instruction *local_58;
  uint local_50;
  undefined4 local_4c;
  Id local_48;
  Id local_44;
  Builder *local_40;
  _Head_base<0UL,_spv::Instruction_*,_false> local_38;
  
  local_4c = (undefined4)CONCAT71(in_register_00000009,columnMajor);
  this_00 = &this->groupedDebugTypes;
  local_58 = (Instruction *)CONCAT44(local_58._4_4_,0x6c);
  local_50 = vectorCount;
  local_44 = vectorType;
  local_40 = this;
  pmVar5 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,(key_type *)&local_58);
  if (0 < (int)((ulong)((long)(pmVar5->
                              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pmVar5->
                             super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    lVar9 = 0;
    do {
      local_58 = (Instruction *)CONCAT44(local_58._4_4_,0x6c);
      pmVar5 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,(key_type *)&local_58);
      pBVar3 = local_40;
      pIVar6 = (pmVar5->super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>)
               ._M_impl.super__Vector_impl_data._M_start[lVar9];
      uVar1 = *(pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      if ((uVar1 & 1) == 0) {
LAB_0045752b:
        __assert_fail("idOperand[op]",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                      ,0xa1,"Id spv::Instruction::getIdOperand(int) const");
      }
      puVar2 = (pIVar6->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (*puVar2 == vectorType) {
        if ((uVar1 & 2) == 0) goto LAB_0045752b;
        local_48 = puVar2[1];
        IVar4 = makeIntegerType(local_40,0x20,false);
        IVar4 = makeIntConstant(pBVar3,IVar4,local_50,false);
        if (local_48 == IVar4) goto LAB_00457518;
      }
      lVar9 = lVar9 + 1;
      local_58 = (Instruction *)CONCAT44(local_58._4_4_,0x6c);
      pmVar5 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,(key_type *)&local_58);
    } while (lVar9 < (int)((ulong)((long)(pmVar5->
                                         super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pmVar5->
                                        super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  pIVar6 = (Instruction *)operator_new(0x60);
  pBVar3 = local_40;
  IVar8 = local_40->uniqueId + 1;
  local_40->uniqueId = IVar8;
  IVar4 = makeVoidType(local_40);
  pIVar6->_vptr_Instruction = (_func_int **)&PTR__Instruction_00afab78;
  pIVar6->resultId = IVar8;
  pIVar6->typeId = IVar4;
  pIVar6->opCode = OpExtInst;
  (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (pIVar6->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar6->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar6->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  pIVar6->block = (Block *)0x0;
  local_58 = pIVar6;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&pIVar6->operands,5);
  if ((pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage ==
      (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) {
    std::vector<bool,_std::allocator<bool>_>::_M_reallocate(&pIVar6->idOperand,5);
  }
  Instruction::addIdOperand(pIVar6,pBVar3->nonSemanticShaderDebugInfo);
  Instruction::addImmediateOperand(pIVar6,0x6c);
  pmVar7 = std::
           map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::operator[](&pBVar3->debugId,&local_44);
  Instruction::addIdOperand(pIVar6,*pmVar7);
  IVar4 = makeIntegerType(pBVar3,0x20,false);
  IVar4 = makeIntConstant(pBVar3,IVar4,local_50,false);
  Instruction::addIdOperand(pIVar6,IVar4);
  IVar4 = makeBoolConstant(pBVar3,local_4c._0_1_,false);
  Instruction::addIdOperand(pIVar6,IVar4);
  local_38._M_head_impl._0_4_ = 0x6c;
  this_01 = (vector<spv::Instruction*,std::allocator<spv::Instruction*>> *)
            std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)&local_38);
  __position._M_current = *(Instruction ***)(this_01 + 8);
  if (__position._M_current == *(Instruction ***)(this_01 + 0x10)) {
    std::vector<spv::Instruction*,std::allocator<spv::Instruction*>>::
    _M_realloc_insert<spv::Instruction*const&>(this_01,__position,&local_58);
    local_38._M_head_impl = local_58;
  }
  else {
    *__position._M_current = pIVar6;
    *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
    local_38._M_head_impl = pIVar6;
  }
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar3->constantsTypesGlobals,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_38);
  if (local_38._M_head_impl != (Instruction *)0x0) {
    (*(local_38._M_head_impl)->_vptr_Instruction[1])();
  }
  Module::mapInstruction(&pBVar3->module,local_58);
  pIVar6 = local_58;
LAB_00457518:
  return pIVar6->resultId;
}

Assistant:

Id Builder::makeMatrixDebugType(Id const vectorType, int const vectorCount, bool columnMajor)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypeMatrix].size(); ++t) {
        type = groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypeMatrix][t];
        if (type->getIdOperand(0) == vectorType &&
            type->getIdOperand(1) == makeUintConstant(vectorCount))
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), makeVoidType(), OpExtInst);
    type->reserveOperands(5);
    type->addIdOperand(nonSemanticShaderDebugInfo);
    type->addImmediateOperand(NonSemanticShaderDebugInfo100DebugTypeMatrix);
    type->addIdOperand(debugId[vectorType]); // vector type id
    type->addIdOperand(makeUintConstant(vectorCount)); // component count id
    type->addIdOperand(makeBoolConstant(columnMajor)); // column-major id

    groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypeMatrix].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}